

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O3

int loadArgs(int argc,char **argv,Settings *s,Transformation *t,string *fjson)

{
  char *pcVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  long *plVar5;
  char *pcVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [12];
  string str;
  allocator<char> local_a1;
  long *local_a0 [2];
  long local_90 [2];
  long *local_80;
  int local_74;
  Settings *local_70;
  string *local_68;
  string *local_60;
  ulong local_58;
  long *local_50 [2];
  long local_40 [2];
  
  uVar9 = 0;
  t->enable = false;
  s->stat = false;
  local_70 = s;
  local_60 = fjson;
  if (argc < 2) {
    usage();
LAB_00108cc1:
    iVar7 = -1;
  }
  else {
    iVar7 = argc + -1;
    local_68 = &t->outdir;
    local_74 = iVar7;
    do {
      iVar8 = (int)uVar9;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_50,argv[(long)iVar8 + 1],(allocator<char> *)local_a0);
      iVar2 = std::__cxx11::string::compare((char *)local_50);
      if (iVar2 == 0) {
        t->enable = true;
        pcVar6 = argv[(long)iVar8 + 2];
        pcVar1 = (char *)(t->outdir)._M_string_length;
        local_58 = uVar9;
        strlen(pcVar6);
        std::__cxx11::string::_M_replace((ulong)local_68,0,pcVar1,(ulong)pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Transformation directory = \"",0x1c);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(t->outdir)._M_dataplus._M_p,
                            (t->outdir)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\".\n",3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_a0,argv[(long)iVar8 + 3],&local_a1);
        plVar5 = local_a0[0];
        piVar4 = __errno_location();
        iVar7 = *piVar4;
        *piVar4 = 0;
        dVar10 = strtod((char *)plVar5,(char **)&local_80);
        if (local_80 == plVar5) {
LAB_00109072:
          std::__throw_invalid_argument("stod");
LAB_0010907e:
          std::__throw_invalid_argument("stod");
LAB_0010908a:
          std::__throw_out_of_range("stod");
LAB_00109096:
          std::__throw_out_of_range("stod");
        }
        else {
          if (*piVar4 != 0) {
            if (*piVar4 != 0x22) goto LAB_00108e22;
            goto LAB_0010908a;
          }
          *piVar4 = iVar7;
LAB_00108e22:
          t->x = dVar10;
          if (local_a0[0] != local_90) {
            operator_delete(local_a0[0],local_90[0] + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,argv[(long)iVar8 + 4],&local_a1);
          plVar5 = local_a0[0];
          iVar7 = *piVar4;
          *piVar4 = 0;
          dVar10 = strtod((char *)local_a0[0],(char **)&local_80);
          if (local_80 == plVar5) goto LAB_0010907e;
          if (*piVar4 != 0) {
            if (*piVar4 != 0x22) goto LAB_00108e99;
            goto LAB_00109096;
          }
          *piVar4 = iVar7;
LAB_00108e99:
          t->y = dVar10;
          if (local_a0[0] != local_90) {
            operator_delete(local_a0[0],local_90[0] + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_a0,argv[(long)iVar8 + 5],&local_a1);
          plVar5 = local_a0[0];
          iVar7 = *piVar4;
          *piVar4 = 0;
          dVar10 = strtod((char *)local_a0[0],(char **)&local_80);
          if (local_80 == plVar5) {
            std::__throw_invalid_argument("stod");
            goto LAB_00109072;
          }
          if (*piVar4 == 0) {
            *piVar4 = iVar7;
LAB_00108f10:
            t->rot = dVar10;
            if (local_a0[0] != local_90) {
              operator_delete(local_a0[0],local_90[0] + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"X translation = ",0x10);
            uVar9 = local_58;
            iVar7 = local_74;
            poVar3 = std::ostream::_M_insert<double>(t->x);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Y translation = ",0x10);
            poVar3 = std::ostream::_M_insert<double>(t->y);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Rotation      = ",0x10);
            poVar3 = std::ostream::_M_insert<double>(t->rot);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
            std::ostream::put(-0x40);
            std::ostream::flush();
            uVar9 = (ulong)((int)uVar9 + 5);
            goto LAB_00109030;
          }
          if (*piVar4 != 0x22) goto LAB_00108f10;
        }
        auVar11 = std::__throw_out_of_range("stod");
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        if (auVar11._8_4_ != 1) {
          _Unwind_Resume(auVar11._0_8_);
        }
        plVar5 = (long *)__cxa_begin_catch(auVar11._0_8_);
        pcVar6 = (char *)(**(code **)(*plVar5 + 0x10))(plVar5);
        poVar3 = std::operator<<((ostream *)&std::cout,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar3);
        usage();
        __cxa_end_catch();
        goto LAB_00108cc1;
      }
      uVar9 = (ulong)(iVar8 + 1);
      iVar2 = std::__cxx11::string::compare((char *)local_50);
      if (iVar2 == 0) {
        local_70->stat = true;
      }
      else {
        std::__cxx11::string::_M_assign((string *)local_60);
      }
LAB_00109030:
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    } while ((int)uVar9 < iVar7);
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int loadArgs(int argc, char* argv[], Settings& s, Transformation& t, std::string& fjson)
{
	t.enable = false;
	s.stat = false;

	if (argc < 2)
	{
		return usage();
	}

	int i = 0;
	while (i < argc - 1)
	{
		try
		{
			std::string str = argv[++i];
			if (str == "-t")
			{
				// Transformation args
				t.enable = true;
				t.outdir = argv[++i];
				std::cout << "Transformation directory = \"" << t.outdir << "\".\n";
				t.x   = std::stod(argv[++i]);
				t.y   = std::stod(argv[++i]);
				t.rot = std::stod(argv[++i]);
				std::cout << "X translation = " << t.x   << "\n";
				std::cout << "Y translation = " << t.y   << "\n";
				std::cout << "Rotation      = " << t.rot << "\n";
				std::cout << std::endl;
			}
			else if (str == "-s")
			{
				// Summary statistics
				s.stat = true;
			}
			else
				fjson = str;
		}
		catch (const std::exception& e)
		{
			std::cout << e.what() << std::endl;
			return usage();
		}
	}
	return 0;
}